

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O1

void Gia_IsoAssignOneClass2(Gia_IsoMan_t *p)

{
  Vec_Int_t *pVVar1;
  word *pwVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  
  pVVar1 = p->vClasses;
  iVar8 = pVVar1->nSize;
  if (iVar8 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x204,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  if (iVar8 == 1) {
    uVar4 = 0xffffffff;
    lVar3 = -1;
    uVar7 = 0;
  }
  else {
    lVar3 = 1;
    do {
      lVar6 = lVar3;
      uVar5 = pVVar1->pArray[lVar6];
      uVar4 = (ulong)uVar5;
      if (uVar5 == 2) {
        uVar4 = 2;
        lVar3 = lVar6;
        break;
      }
      lVar3 = lVar6 + 2;
    } while ((int)lVar3 < iVar8);
    uVar7 = lVar3 - 1;
    lVar3 = (long)pVVar1->pArray[(int)lVar6 - 1U & 0xfffffffe];
  }
  uVar5 = (uint)uVar7;
  if ((int)uVar4 < 2) {
    __assert_fail("nSize > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x20a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  piVar10 = p->pUniques;
  pwVar2 = p->pStoreW;
  uVar9 = pwVar2[lVar3] >> 0x20;
  if ((int)uVar4 == 2) {
    if (piVar10[uVar9] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x20e,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar8 = p->nUniques;
    p->nUniques = iVar8 + 1;
    piVar10[uVar9] = iVar8;
    p->nSingles = p->nSingles + 1;
    p->nEntries = p->nEntries + -1;
    uVar9 = pwVar2[lVar3 + 1] >> 0x20;
    if (piVar10[uVar9] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x213,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar8 = p->nUniques;
    p->nUniques = iVar8 + 1;
    piVar10[uVar9] = iVar8;
    p->nSingles = p->nSingles + 1;
  }
  else {
    if (piVar10[uVar9] != 0) {
      __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                    ,0x21a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
    }
    iVar8 = p->nUniques;
    p->nUniques = iVar8 + 1;
    piVar10[uVar9] = iVar8;
    p->nSingles = p->nSingles + 1;
  }
  p->nEntries = p->nEntries + -1;
  iVar8 = pVVar1->nSize + -2;
  if ((int)uVar5 < iVar8) {
    piVar10 = pVVar1->pArray + (uVar7 & 0xffffffff) + 3;
    do {
      *(undefined8 *)(piVar10 + -3) = *(undefined8 *)(piVar10 + -1);
      iVar8 = pVVar1->nSize + -2;
      piVar10 = piVar10 + 2;
      uVar5 = (int)uVar7 + 2;
      uVar7 = (ulong)uVar5;
    } while ((int)uVar5 < iVar8);
  }
  pVVar1->nSize = iVar8;
  printf("Broke ties in class %d of size %d at level %d.\n",(ulong)(uVar5 >> 1),uVar4,
         (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + lVar3 * 8 + 4)]);
  return;
}

Assistant:

void Gia_IsoAssignOneClass2( Gia_IsoMan_t * p )
{
    int i, iBegin = -1, nSize = -1;
    // find two variable class
    assert( Vec_IntSize(p->vClasses) > 0 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 2 )
            break;
    }
    assert( nSize > 1 );

    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }

    for ( ; i < Vec_IntSize(p->vClasses) - 2; i += 2 )
    {
        p->vClasses->pArray[i+0] = p->vClasses->pArray[i+2];
        p->vClasses->pArray[i+1] = p->vClasses->pArray[i+3];
    }
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    printf( "Broke ties in class %d of size %d at level %d.\n", i/2, nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}